

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O2

void __thiscall RString::SafeDealloc(RString *this)

{
  char *pcVar1;
  int i;
  undefined8 uStack_8;
  
  pcVar1 = this->myString;
  if (pcVar1 != (char *)0x0) {
    uStack_8 = pcVar1 + -1;
    if ('\0' < pcVar1[-1]) {
      *uStack_8 = pcVar1[-1] + -1;
      this->myString = (char *)0x0;
      return;
    }
    if (pcVar1 <= (char *)((long)&uStack_8 + 4U)) {
      this->myString = uStack_8;
      operator_delete__(uStack_8);
    }
  }
  return;
}

Assistant:

void RString::SafeDealloc(void)
{
	if(!myString)
		return;
	if(RefCount() > 0)
	{
		SetRefCount(RefCount() - 1);
		myString = nullptr;
		return;
	}
	//hack
	int i;
	if((int *)myString > &i)
		return;
	
	myString--;
	delete[] myString;
}